

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

void __thiscall WorkQueue<CGL::WorkItem>::put_work(WorkQueue<CGL::WorkItem> *this,WorkItem *item)

{
  mutex *in_RSI;
  value_type *in_RDI;
  vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_> *unaff_retaddr;
  
  std::mutex::lock(in_RSI);
  std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::push_back(unaff_retaddr,in_RDI);
  std::mutex::unlock((mutex *)0x15521b);
  return;
}

Assistant:

void put_work(const T& item) {
    lock.lock();
    storage.push_back(item);
    lock.unlock();
  }